

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.cc
# Opt level: O0

Status __thiscall
sentencepiece::SentencePieceProcessor::Normalize
          (SentencePieceProcessor *this,string_view input,string *normalized)

{
  bool bVar1;
  StatusBuilder *pSVar2;
  pointer pNVar3;
  pointer in_R8;
  int local_1d8 [4];
  StatusBuilder local_1c8;
  undefined1 local_48 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> norm_to_orig;
  string *normalized_local;
  SentencePieceProcessor *this_local;
  string_view input_local;
  
  norm_to_orig.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_R8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)(input._M_len + 0x10));
  if (bVar1) {
    pNVar3 = std::
             unique_ptr<sentencepiece::normalizer::Normalizer,_std::default_delete<sentencepiece::normalizer::Normalizer>_>
             ::operator->((unique_ptr<sentencepiece::normalizer::Normalizer,_std::default_delete<sentencepiece::normalizer::Normalizer>_>
                           *)(input._M_len + 0x10));
    (*pNVar3->_vptr_Normalizer[4])
              (this,pNVar3,input._M_str,normalized,
               norm_to_orig.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,local_48);
  }
  else {
    util::StatusBuilder::StatusBuilder(&local_1c8,kInternal);
    pSVar2 = util::StatusBuilder::operator<<
                       (&local_1c8,(char (*) [31])"src/sentencepiece_processor.cc");
    pSVar2 = util::StatusBuilder::operator<<(pSVar2,(char (*) [2])0x339e65);
    local_1d8[0] = 0x3a8;
    pSVar2 = util::StatusBuilder::operator<<(pSVar2,local_1d8);
    pSVar2 = util::StatusBuilder::operator<<(pSVar2,(char (*) [4])") [");
    pSVar2 = util::StatusBuilder::operator<<(pSVar2,(char (*) [12])"normalizer_");
    util::StatusBuilder::operator<<(pSVar2,(char (*) [3])"] ");
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
    util::StatusBuilder::~StatusBuilder(&local_1c8);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this;
}

Assistant:

util::Status SentencePieceProcessor::Normalize(absl::string_view input,
                                               std::string *normalized) const {
  std::vector<size_t> norm_to_orig;
  CHECK_OR_RETURN(normalizer_);
  return normalizer_->Normalize(input, normalized, &norm_to_orig);
}